

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O0

void Nwk_ManDeriveMinCut(Gia_Man_t *p,int fVerbose)

{
  Nwk_Obj_t *pMan;
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *vArr1n;
  Vec_Int_t *vArr2n;
  bool bVar8;
  int local_84;
  int iObjId;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vDiff1;
  Vec_Int_t *vDiff0;
  Vec_Int_t *vCommon;
  Vec_Int_t *vMapInv;
  Vec_Int_t *vLeaves2;
  Vec_Int_t *vNodes2;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vNodes;
  Vec_Int_t *vPPis;
  Vec_Ptr_t *vMinCut;
  Nwk_Obj_t *pNode;
  Nwk_Man_t *pNtk;
  Gia_Man_t *pGStack_10;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  pNtk._4_4_ = fVerbose;
  pGStack_10 = p;
  Gia_ManGlaCollect(p,p->vGateClasses,(Vec_Int_t **)0x0,&vNodes,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0)
  ;
  vLeaves = Vec_IntAlloc(100);
  vNodes2 = Vec_IntAlloc(100);
  Gia_ManIncrementTravId(pGStack_10);
  local_84 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vNodes);
    pGVar1 = pGStack_10;
    bVar8 = false;
    if (local_84 < iVar2) {
      iVar2 = Vec_IntEntry(vNodes,local_84);
      _iObjId = Gia_ManObj(pGVar1,iVar2);
      bVar8 = _iObjId != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    Nwk_ManColleacReached_rec(pGStack_10,_iObjId,vLeaves,vNodes2);
    local_84 = local_84 + 1;
  }
  pNode = (Nwk_Obj_t *)Nwk_ManCreateFromGia(pGStack_10,vNodes,vLeaves,vNodes2,&vCommon);
  iVar2 = Nwk_ManPiNum((Nwk_Man_t *)pNode);
  iVar3 = Nwk_ManPoNum((Nwk_Man_t *)pNode);
  pMan = pNode;
  if (iVar2 == iVar3) {
    iVar2 = Nwk_ManPiNum((Nwk_Man_t *)pNode);
    vPPis = (Vec_Int_t *)Nwk_ManRetimeCutBackward((Nwk_Man_t *)pMan,iVar2,pNtk._4_4_);
    vLeaves2 = Vec_IntAlloc(100);
    vMapInv = Vec_IntAlloc(100);
    Gia_ManIncrementTravId(pGStack_10);
    for (local_84 = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)vPPis), local_84 < iVar2;
        local_84 = local_84 + 1) {
      vMinCut = (Vec_Ptr_t *)Vec_PtrEntry((Vec_Ptr_t *)vPPis,local_84);
      pGVar1 = pGStack_10;
      pVVar7 = vCommon;
      iVar2 = Nwk_ObjId((Nwk_Obj_t *)vMinCut);
      iVar2 = Vec_IntEntry(pVVar7,iVar2);
      _iObjId = Gia_ManObj(pGVar1,iVar2);
      iVar2 = Gia_ObjIsConst0(_iObjId);
      if (iVar2 == 0) {
        Nwk_ManColleacReached_rec(pGStack_10,_iObjId,vLeaves2,vMapInv);
      }
    }
    if (pNtk._4_4_ != 0) {
      iVar2 = Vec_IntSize(vNodes);
      uVar4 = Vec_PtrSize((Vec_Ptr_t *)vPPis);
      uVar5 = Vec_IntSize(vLeaves);
      uVar6 = Vec_IntSize(vLeaves2);
      printf("Min-cut: %d -> %d.  Nodes %d -> %d.  ",(ulong)(iVar2 + 1),(ulong)uVar4,(ulong)uVar5,
             (ulong)uVar6);
    }
    Vec_IntFree(vNodes);
    Vec_PtrFree((Vec_Ptr_t *)vPPis);
    Vec_IntFree(vCommon);
    Nwk_ManFree((Nwk_Man_t *)pNode);
    Vec_IntSort(vLeaves,0);
    Vec_IntSort(vLeaves2,0);
    iVar2 = Vec_IntSize(vLeaves);
    pVVar7 = Vec_IntAlloc(iVar2);
    vArr1n = Vec_IntAlloc(100);
    vArr2n = Vec_IntAlloc(100);
    Vec_IntTwoSplit(vLeaves,vLeaves2,pVVar7,vArr1n,vArr2n);
    if (pNtk._4_4_ != 0) {
      uVar4 = Vec_IntSize(pVVar7);
      uVar5 = Vec_IntSize(vArr1n);
      uVar6 = Vec_IntSize(vArr2n);
      printf("Common = %d.  Diff0 = %d. Diff1 = %d.\n",(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    }
    for (local_84 = 0; iVar2 = Vec_IntSize(vArr1n), local_84 < iVar2; local_84 = local_84 + 1) {
      iVar2 = Vec_IntEntry(vArr1n,local_84);
      Vec_IntWriteEntry(pGStack_10->vGateClasses,iVar2,1);
    }
    Vec_IntFree(vNodes2);
    Vec_IntFree(vLeaves);
    Vec_IntFree(vMapInv);
    Vec_IntFree(vLeaves2);
    Vec_IntFree(pVVar7);
    Vec_IntFree(vArr1n);
    Vec_IntFree(vArr2n);
    local_84 = 0;
    while( true ) {
      bVar8 = false;
      if (local_84 < pGStack_10->nObjs) {
        _iObjId = Gia_ManObj(pGStack_10,local_84);
        bVar8 = _iObjId != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar2 = Vec_IntEntry(pGStack_10->vGateClasses,local_84);
      if ((((iVar2 != 0) && (iVar2 = Gia_ObjIsConst0(_iObjId), iVar2 == 0)) &&
          (iVar2 = Gia_ObjIsRo(pGStack_10,_iObjId), iVar2 == 0)) &&
         (iVar2 = Gia_ObjIsAnd(_iObjId), iVar2 == 0)) {
        __assert_fail("Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkAig.c"
                      ,0x121,"void Nwk_ManDeriveMinCut(Gia_Man_t *, int)");
      }
      local_84 = local_84 + 1;
    }
    return;
  }
  __assert_fail("Nwk_ManPiNum(pNtk) == Nwk_ManPoNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkAig.c"
                ,0xed,"void Nwk_ManDeriveMinCut(Gia_Man_t *, int)");
}

Assistant:

void Nwk_ManDeriveMinCut( Gia_Man_t * p, int fVerbose )
{
    Nwk_Man_t * pNtk;
    Nwk_Obj_t * pNode;
    Vec_Ptr_t * vMinCut;
    Vec_Int_t * vPPis, * vNodes, * vLeaves, * vNodes2, * vLeaves2, * vMapInv;
    Vec_Int_t * vCommon, * vDiff0, * vDiff1;
    Gia_Obj_t * pObj;
    int i, iObjId;
    // get inputs
    Gia_ManGlaCollect( p, p->vGateClasses, NULL, &vPPis, NULL, NULL );
    // collect nodes rechable from PPIs
    vNodes = Vec_IntAlloc( 100 );
    vLeaves = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
        Nwk_ManColleacReached_rec( p, pObj, vNodes, vLeaves );
    // derive the new network
    pNtk = Nwk_ManCreateFromGia( p, vPPis, vNodes, vLeaves, &vMapInv );
    assert( Nwk_ManPiNum(pNtk) == Nwk_ManPoNum(pNtk) );
    // create min-cut
    vMinCut = Nwk_ManRetimeCutBackward( pNtk, Nwk_ManPiNum(pNtk), fVerbose );
    // copy from the GIA back
//    Aig_ManForEachObj( p, pObj, i )
//        ((Nwk_Obj_t *)pObj->pData)->pCopy = pObj;
    // mark min-cut nodes
    vNodes2 = Vec_IntAlloc( 100 );
    vLeaves2 = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vMinCut, pNode, i )
    {
        pObj = Gia_ManObj( p, Vec_IntEntry(vMapInv, Nwk_ObjId(pNode)) );
        if ( Gia_ObjIsConst0(pObj) )
            continue;
        Nwk_ManColleacReached_rec( p, pObj, vNodes2, vLeaves2 );
    }
    if ( fVerbose )
        printf( "Min-cut: %d -> %d.  Nodes %d -> %d.  ", Vec_IntSize(vPPis)+1, Vec_PtrSize(vMinCut), Vec_IntSize(vNodes), Vec_IntSize(vNodes2) );
    Vec_IntFree( vPPis );
    Vec_PtrFree( vMinCut );
    Vec_IntFree( vMapInv );
    Nwk_ManFree( pNtk );

    // sort the results
    Vec_IntSort( vNodes, 0 );
    Vec_IntSort( vNodes2, 0 );
    vCommon = Vec_IntAlloc( Vec_IntSize(vNodes) );
    vDiff0 = Vec_IntAlloc( 100 );
    vDiff1 = Vec_IntAlloc( 100 );
    Vec_IntTwoSplit( vNodes, vNodes2, vCommon, vDiff0, vDiff1 );
    if ( fVerbose )
        printf( "Common = %d.  Diff0 = %d. Diff1 = %d.\n", Vec_IntSize(vCommon), Vec_IntSize(vDiff0), Vec_IntSize(vDiff1) );

    // fill in
    Vec_IntForEachEntry( vDiff0, iObjId, i )
        Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );

    Vec_IntFree( vLeaves );
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves2 );
    Vec_IntFree( vNodes2 );

    Vec_IntFree( vCommon );
    Vec_IntFree( vDiff0 );
    Vec_IntFree( vDiff1 );

    // check abstraction
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Vec_IntEntry( p->vGateClasses, i ) == 0 )
            continue;
        assert( Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) );
    }
}